

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

void __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::sparse_hashtable(sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *this,MoveDontCopyT mover,
                  sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *ht,size_type min_buckets_wanted)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  type tVar6;
  undefined8 uVar7;
  size_type sVar8;
  size_type sVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  undefined1 local_29;
  
  iVar4 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          super_Hasher.id_;
  iVar5 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          super_Hasher.num_hashes_;
  uVar7 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_compares_;
  sVar8 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          enlarge_threshold_;
  uVar1 = *(undefined4 *)
           ((long)&(ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
                   enlarge_threshold_ + 4);
  sVar9 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  uVar2 = *(undefined4 *)
           ((long)&(ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
                   shrink_threshold_ + 4);
  fVar15 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           shrink_factor_;
  bVar10 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           consider_shrink_;
  bVar11 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_empty_;
  bVar12 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_deleted_;
  uVar13 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           field_0x2b;
  uVar3 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.enlarge_factor_
       = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
         enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
       fVar15;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.consider_shrink_
       = bVar10;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_empty_ =
       bVar11;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_deleted_ =
       bVar12;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.field_0x2b =
       uVar13;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.num_ht_copies_ =
       uVar3;
  *(int *)&(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           enlarge_threshold_ = (int)sVar8;
  *(undefined4 *)
   ((long)&(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           enlarge_threshold_ + 4) = uVar1;
  *(int *)&(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           shrink_threshold_ = (int)sVar9;
  *(undefined4 *)
   ((long)&(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           shrink_threshold_ + 4) = uVar2;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.id_
       = iVar4;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar5;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar7;
  iVar4 = (ht->key_info).super_Hasher.num_hashes_;
  iVar5 = (ht->key_info).super_Hasher.num_compares_;
  tVar6 = (ht->key_info).delkey;
  (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar4;
  (this->key_info).super_Hasher.num_compares_ = iVar5;
  (this->key_info).delkey = tVar6;
  this->num_deleted = 0;
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparsetable(&this->table,0,&local_29);
  fVar15 = (float)(this->table).settings.table_size;
  fVar16 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           enlarge_factor_ * fVar15;
  uVar14 = (ulong)fVar16;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar16 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  fVar15 = fVar15 * (this->settings).
                    super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_factor_;
  uVar14 = (ulong)fVar15;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar15 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.consider_shrink_
       = false;
  move_from(this,mover,ht,min_buckets_wanted);
  return;
}

Assistant:

sparse_hashtable(MoveDontCopyT mover, sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    move_from(mover, ht, min_buckets_wanted);  // ignores deleted entries
  }